

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O3

TransactionController *
cfd::api::TransactionApiBase::AddSign<cfd::TransactionController>
          (TransactionController *__return_storage_ptr__,
          function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *create_controller,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  pointer pSVar1;
  bool bVar2;
  CfdException *this;
  byte bVar3;
  ulong uVar4;
  ScriptElement *pSVar5;
  ScriptElement *element;
  pointer pSVar6;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> sign_stack;
  ScriptOperator op_code;
  ScriptBuilder builder;
  Script script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_158;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [112];
  Script local_a8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *local_70;
  Script local_68;
  
  if (hex->_M_string_length == 0) {
    local_138._0_8_ = "cfdapi_transaction_base.cpp";
    local_138._8_4_ = kOpGreaterThanOrEqual64;
    local_128._0_8_ = "AddSign";
    core::logger::log<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_138,kCfdLogLevelWarning,
               "Failed to AddSign. Invalid hex string. empty data. tx=[{}]",hex);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Invalid hex string. empty data.","");
    core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((create_controller->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*create_controller->_M_invoker)(__return_storage_ptr__,(_Any_data *)create_controller,hex);
  local_158.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar6 = (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 == pSVar1) {
    if (is_witness) goto LAB_003e3549;
  }
  else {
    bVar3 = 0;
    local_70 = sign_params;
    do {
      bVar2 = SignParameter::IsOpCode(pSVar6);
      if (bVar2) {
        SignParameter::GetOpCode((ScriptOperator *)local_138,pSVar6);
        bVar2 = core::ScriptOperator::IsPushOperator((ScriptOperator *)local_138);
        local_138._0_8_ = &PTR__ScriptOperator_0086d348;
        if ((ScriptElement *)local_128._0_8_ != (ScriptElement *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,local_118._0_8_ + 1);
        }
        bVar3 = bVar3 | bVar2;
      }
      SignParameter::ConvertToSignature((ByteData *)local_138,pSVar6);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&local_158,(ByteData *)local_138);
      if ((ScriptElement *)local_138._0_8_ != (ScriptElement *)0x0) {
        operator_delete((void *)local_138._0_8_,local_128._0_8_ - local_138._0_8_);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar1);
    if (is_witness) {
LAB_003e3549:
      if (clear_stack) {
        TransactionController::RemoveWitnessStackAll(__return_storage_ptr__,txid,vout);
      }
      TransactionController::AddWitnessStack(__return_storage_ptr__,txid,vout,&local_158);
      goto LAB_003e35aa;
    }
    if (bVar3 != 0) {
      core::Script::Script(&local_68);
      if (!clear_stack) {
        TransactionController::GetTxIn((TxInReference *)local_138,__return_storage_ptr__,txid,vout);
        core::Script::Script(&local_a8,(Script *)(local_118 + 0x10));
        core::Script::operator=(&local_68,&local_a8);
        core::Script::~Script(&local_a8);
        core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_138);
      }
      local_a8._vptr_Script = (_func_int **)&PTR__ScriptBuilder_0086beb8;
      local_a8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      core::Script::GetElementList
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 local_138,&local_68);
      if ((ScriptElement *)local_138._0_8_ !=
          (ScriptElement *)CONCAT44(local_138._12_4_,local_138._8_4_)) {
        pSVar5 = (ScriptElement *)local_138._0_8_;
        do {
          core::ScriptBuilder::AppendElement((ScriptBuilder *)&local_a8,pSVar5);
          pSVar5 = pSVar5 + 1;
        } while (pSVar5 != (ScriptElement *)CONCAT44(local_138._12_4_,local_138._8_4_));
      }
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 local_138);
      pSVar6 = (local_70->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (local_70->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar6 != pSVar1) {
        do {
          bVar2 = SignParameter::IsOpCode(pSVar6);
          if (bVar2) {
            SignParameter::GetOpCode((ScriptOperator *)local_138,pSVar6);
            core::ScriptBuilder::AppendOperator
                      ((ScriptBuilder *)&local_a8,(ScriptOperator *)local_138);
            local_138._0_8_ = &PTR__ScriptOperator_0086d348;
            if ((ScriptElement *)local_128._0_8_ != (ScriptElement *)(local_128 + 0x10)) {
              uVar4 = local_118._0_8_ + 1;
              pSVar5 = (ScriptElement *)local_128._0_8_;
LAB_003e34c4:
              operator_delete(pSVar5,uVar4);
            }
          }
          else {
            SignParameter::ConvertToSignature((ByteData *)local_138,pSVar6);
            core::ScriptBuilder::AppendData((ScriptBuilder *)&local_a8,(ByteData *)local_138);
            if ((ScriptElement *)local_138._0_8_ != (ScriptElement *)0x0) {
              uVar4 = local_128._0_8_ - local_138._0_8_;
              pSVar5 = (ScriptElement *)local_138._0_8_;
              goto LAB_003e34c4;
            }
          }
          pSVar6 = pSVar6 + 1;
        } while (pSVar6 != pSVar1);
      }
      core::ScriptBuilder::Build((Script *)local_138,(ScriptBuilder *)&local_a8);
      TransactionController::SetUnlockingScript
                (__return_storage_ptr__,txid,vout,(Script *)local_138);
      core::Script::~Script((Script *)local_138);
      local_a8._vptr_Script = (_func_int **)&PTR__ScriptBuilder_0086beb8;
      if (local_a8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      core::Script::~Script(&local_68);
      goto LAB_003e35aa;
    }
  }
  if (clear_stack) {
    TransactionController::SetUnlockingScript(__return_storage_ptr__,txid,vout,&local_158);
  }
  else {
    TransactionController::InsertUnlockingScript(__return_storage_ptr__,txid,vout,&local_158);
  }
LAB_003e35aa:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_158);
  return __return_storage_ptr__;
}

Assistant:

T TransactionApiBase::AddSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) {
  if (hex.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddSign. Invalid hex string. empty data. tx=[{}]", hex);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  // TransactionController作成
  T txc = create_controller(hex);

  std::vector<ByteData> sign_stack;
  bool has_op_code = false;
  for (const SignParameter& sign_param : sign_params) {
    if (sign_param.IsOpCode()) {
      ScriptOperator op_code = sign_param.GetOpCode();
      if (op_code.IsPushOperator()) {
        has_op_code = true;
      }
    }
    sign_stack.push_back(sign_param.ConvertToSignature());
  }

  if (is_witness) {
    if (clear_stack) {
      txc.RemoveWitnessStackAll(txid, vout);
    }
    txc.AddWitnessStack(txid, vout, sign_stack);
  } else if (!has_op_code) {
    if (clear_stack) {
      txc.SetUnlockingScript(txid, vout, sign_stack);
    } else {
      txc.InsertUnlockingScript(txid, vout, sign_stack);
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = txc.GetTxIn(txid, vout).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    txc.SetUnlockingScript(txid, vout, builder.Build());
  }

  return txc;
}